

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

BasicBrokerInfo * __thiscall
helics::CoreBroker::getBrokerById(CoreBroker *this,GlobalBrokerId brokerid)

{
  GlobalBrokerId GVar1;
  __normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
  _Var2;
  __normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
  _Var3;
  GlobalBrokerId local_c;
  
  if ((this->super_BrokerBase).field_0x294 == '\x01') {
    GVar1.gid = brokerid.gid + 0x90000000;
    if (brokerid.gid < 0x70000000) {
      GVar1.gid = brokerid.gid;
    }
    if ((GVar1.gid < 0) ||
       ((int)((ulong)((long)(this->mBrokers).dataStorage.
                            super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->mBrokers).dataStorage.
                           super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x45d1745d <=
        GVar1.gid)) {
      _Var3._M_current = (BasicBrokerInfo *)0x0;
    }
    else {
      _Var3._M_current =
           (this->mBrokers).dataStorage.
           super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
           _M_impl.super__Vector_impl_data._M_start + (uint)GVar1.gid;
    }
  }
  else {
    local_c.gid = brokerid.gid;
    _Var2 = gmlc::containers::
            DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
            ::find(&this->mBrokers,&local_c);
    _Var3._M_current = (BasicBrokerInfo *)0x0;
    if (_Var2._M_current !=
        (this->mBrokers).dataStorage.
        super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      _Var3 = _Var2;
    }
  }
  return _Var3._M_current;
}

Assistant:

const BasicBrokerInfo* CoreBroker::getBrokerById(GlobalBrokerId brokerid) const
{
    if (isRootc) {
        auto brkNum = brokerid.localIndex();
        return (isValidIndex(brkNum, mBrokers)) ? &mBrokers[brkNum] : nullptr;
    }

    auto fnd = mBrokers.find(brokerid);
    return (fnd != mBrokers.end()) ? &(*fnd) : nullptr;
}